

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall FormatterTest_HashFlag_Test::TestBody(FormatterTest_HashFlag_Test *this)

{
  bool bVar1;
  int *in_RCX;
  int *piVar2;
  char *pcVar3;
  uint *puVar4;
  long *plVar5;
  unsigned_long *puVar6;
  longlong *plVar7;
  unsigned_long_long *puVar8;
  double *args;
  char *pcVar9;
  char (*args_00) [4];
  void **args_01;
  longdouble local_d8;
  AssertionResult gtest_ar;
  string gtest_expected_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x2a);
  fmt::v5::format<char[6],int>(&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,in_RCX)
  ;
  piVar2 = (int *)0x1f1bef;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","format(\"{0:#}\", 42)",(char (*) [3])0x1f1bef,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar2 = (int *)0x3ff;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x3ff,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0xffffffd6);
  fmt::v5::format<char[6],int>(&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,piVar2)
  ;
  piVar2 = (int *)0x1ea562;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-42\"","format(\"{0:#}\", -42)",(char (*) [4])0x1ea562,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar2 = (int *)0x400;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x400,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x2a);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)"{0:#b}",(char (*) [7])&local_d8,piVar2);
  piVar2 = (int *)0x1e969d;
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0b101010\"","format(\"{0:#b}\", 42)",(char (*) [9])0x1e969d,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar2 = (int *)0x401;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x401,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x2a);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)"{0:#B}",(char (*) [7])&local_d8,piVar2);
  pcVar3 = "0B101010";
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0B101010\"","format(\"{0:#B}\", 42)",(char (*) [9])"0B101010",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x402;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x402,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0xffffffd6);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)"{0:#b}",(char (*) [7])&local_d8,(int *)pcVar3);
  pcVar3 = "-0b101010";
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-0b101010\"","format(\"{0:#b}\", -42)",
             (char (*) [10])"-0b101010",&gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x403;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x403,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x42);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,(int *)pcVar3);
  piVar2 = (int *)0x1e9716;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x42\"","format(\"{0:#x}\", 0x42)",(char (*) [5])0x1e9716,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar2 = (int *)0x404;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x404,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x42);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)"{0:#X}",(char (*) [7])&local_d8,piVar2);
  pcVar3 = "0X42";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0X42\"","format(\"{0:#X}\", 0x42)",(char (*) [5])"0X42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x405;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x405,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0xffffffbe);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,(int *)pcVar3);
  pcVar3 = "-0x42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-0x42\"","format(\"{0:#x}\", -0x42)",(char (*) [6])"-0x42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x406;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x406,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x22);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,(int *)pcVar3);
  piVar2 = (int *)0x1e9756;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"042\"","format(\"{0:#o}\", 042)",(char (*) [4])0x1e9756,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    piVar2 = (int *)0x407;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x407,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0xffffffde);
  fmt::v5::format<char[7],int>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,piVar2);
  pcVar3 = "-042";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-042\"","format(\"{0:#o}\", -042)",(char (*) [5])"-042",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x408;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x408,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x2a);
  fmt::v5::format<char[6],unsigned_int>
            (&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,(uint *)pcVar3);
  puVar4 = (uint *)0x1f1bef;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","format(\"{0:#}\", 42u)",(char (*) [3])0x1f1bef,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    puVar4 = (uint *)0x409;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x409,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x42);
  fmt::v5::format<char[7],unsigned_int>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,puVar4);
  puVar4 = (uint *)0x1e9716;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x42\"","format(\"{0:#x}\", 0x42u)",(char (*) [5])0x1e9716,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    puVar4 = (uint *)0x40a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT64(local_d8._4_6_,0x22);
  fmt::v5::format<char[7],unsigned_int>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,puVar4);
  plVar5 = (long *)0x1e9756;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"042\"","format(\"{0:#o}\", 042u)",(char (*) [4])0x1e9756,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar5 = (long *)0x40b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0xffffffffffffffd6);
  fmt::v5::format<char[6],long>
            (&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,plVar5);
  plVar5 = (long *)0x1ea562;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-42\"","format(\"{0:#}\", -42l)",(char (*) [4])0x1ea562,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar5 = (long *)0x40d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40d,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x42);
  fmt::v5::format<char[7],long>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,plVar5);
  plVar5 = (long *)0x1e9716;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x42\"","format(\"{0:#x}\", 0x42l)",(char (*) [5])0x1e9716,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar5 = (long *)0x40e;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40e,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0xffffffffffffffbe);
  fmt::v5::format<char[7],long>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,plVar5);
  pcVar3 = "-0x42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-0x42\"","format(\"{0:#x}\", -0x42l)",(char (*) [6])"-0x42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x40f;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x40f,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x22);
  fmt::v5::format<char[7],long>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,(long *)pcVar3);
  plVar5 = (long *)0x1e9756;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"042\"","format(\"{0:#o}\", 042l)",(char (*) [4])0x1e9756,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar5 = (long *)0x410;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x410,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0xffffffffffffffde);
  fmt::v5::format<char[7],long>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,plVar5);
  pcVar3 = "-042";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-042\"","format(\"{0:#o}\", -042l)",(char (*) [5])"-042",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x411;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x411,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x2a);
  fmt::v5::format<char[6],unsigned_long>
            (&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,(unsigned_long *)pcVar3);
  puVar6 = (unsigned_long *)0x1f1bef;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","format(\"{0:#}\", 42ul)",(char (*) [3])0x1f1bef,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    puVar6 = (unsigned_long *)0x412;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x412,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x42);
  fmt::v5::format<char[7],unsigned_long>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,puVar6);
  puVar6 = (unsigned_long *)0x1e9716;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x42\"","format(\"{0:#x}\", 0x42ul)",(char (*) [5])0x1e9716,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    puVar6 = (unsigned_long *)0x413;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x413,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x22);
  fmt::v5::format<char[7],unsigned_long>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,puVar6);
  plVar7 = (longlong *)0x1e9756;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"042\"","format(\"{0:#o}\", 042ul)",(char (*) [4])0x1e9756,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar7 = (longlong *)0x414;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x414,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0xffffffffffffffd6);
  fmt::v5::format<char[6],long_long>
            (&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,plVar7);
  plVar7 = (longlong *)0x1ea562;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-42\"","format(\"{0:#}\", -42ll)",(char (*) [4])0x1ea562,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar7 = (longlong *)0x416;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x416,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x42);
  fmt::v5::format<char[7],long_long>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,plVar7);
  plVar7 = (longlong *)0x1e9716;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x42\"","format(\"{0:#x}\", 0x42ll)",(char (*) [5])0x1e9716,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar7 = (longlong *)0x417;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x417,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0xffffffffffffffbe);
  fmt::v5::format<char[7],long_long>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,plVar7);
  pcVar3 = "-0x42";
  testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-0x42\"","format(\"{0:#x}\", -0x42ll)",(char (*) [6])"-0x42",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x418;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x418,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x22);
  fmt::v5::format<char[7],long_long>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,(longlong *)pcVar3);
  plVar7 = (longlong *)0x1e9756;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"042\"","format(\"{0:#o}\", 042ll)",(char (*) [4])0x1e9756,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    plVar7 = (longlong *)0x419;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x419,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0xffffffffffffffde);
  fmt::v5::format<char[7],long_long>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,plVar7);
  pcVar3 = "-042";
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-042\"","format(\"{0:#o}\", -042ll)",(char (*) [5])"-042",
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x41a;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41a,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x2a);
  fmt::v5::format<char[6],unsigned_long_long>
            (&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,
             (unsigned_long_long *)pcVar3);
  puVar8 = (unsigned_long_long *)0x1f1bef;
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","format(\"{0:#}\", 42ull)",(char (*) [3])0x1f1bef,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    puVar8 = (unsigned_long_long *)0x41b;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41b,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x42);
  fmt::v5::format<char[7],unsigned_long_long>
            (&gtest_expected_message,(v5 *)"{0:#x}",(char (*) [7])&local_d8,puVar8);
  puVar8 = (unsigned_long_long *)0x1e9716;
  testing::internal::CmpHelperEQ<char[5],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"0x42\"","format(\"{0:#x}\", 0x42ull)",(char (*) [5])0x1e9716,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    puVar8 = (unsigned_long_long *)0x41c;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41c,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x22);
  fmt::v5::format<char[7],unsigned_long_long>
            (&gtest_expected_message,(v5 *)0x1f1059,(char (*) [7])&local_d8,puVar8);
  args = (double *)0x1e9756;
  testing::internal::CmpHelperEQ<char[4],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"042\"","format(\"{0:#o}\", 042ull)",(char (*) [4])0x1e9756,
             &gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    args = (double *)0x41d;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x41d,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0xc045000000000000);
  fmt::v5::format<char[6],double>
            (&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,args);
  pcVar3 = "-42.0000";
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-42.0000\"","format(\"{0:#}\", -42.0)",
             (char (*) [9])"-42.0000",&gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x422;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x422,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_d8 = (longdouble)-42.0;
  fmt::v5::format<char[6],long_double>
            (&gtest_expected_message,(v5 *)"{0:#}",(char (*) [6])&local_d8,(longdouble *)pcVar3);
  pcVar3 = "-42.0000";
  testing::internal::CmpHelperEQ<char[9],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"-42.0000\"","format(\"{0:#}\", -42.0l)",
             (char (*) [9])"-42.0000",&gtest_expected_message);
  std::__cxx11::string::~string((string *)&gtest_expected_message);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_expected_message);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    pcVar3 = (char *)0x423;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x423,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_expected_message);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"missing \'}\' in format string",
               (allocator *)&local_d8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_d8 = (longdouble)CONCAT91(local_d8._1_9_,99);
      fmt::v5::format<char[5],char>(&local_38,(v5 *)"{0:#",(char (*) [5])&local_d8,pcVar3);
      std::__cxx11::string::~string((string *)&local_38);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [101])
               "Expected: format(\"{0:#\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  pcVar9 = (char *)0x425;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x425,pcVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"invalid format specifier for char",
               (allocator *)&local_d8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_d8 = (longdouble)CONCAT91(local_d8._1_9_,99);
      fmt::v5::format<char[6],char>(&local_58,(v5 *)"{0:#}",(char (*) [6])&local_d8,pcVar9);
      std::__cxx11::string::~string((string *)&local_58);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [102])
               "Expected: format(\"{0:#}\", \'c\') throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_00 = (char (*) [4])0x427;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x427,pcVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"format specifier requires numeric argument",
               (allocator *)&local_d8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[6],char[4]>(&local_78,(v5 *)"{0:#}",(char (*) [6])0x1e6e09,args_00);
      std::__cxx11::string::~string((string *)&local_78);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [104])
               "Expected: format(\"{0:#}\", \"abc\") throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  args_01 = (void **)0x429;
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x429,pcVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  testing::AssertionSuccess();
  if (gtest_ar.success_ == true) {
    std::__cxx11::string::string
              ((string *)&gtest_expected_message,"format specifier requires numeric argument",
               (allocator *)&local_d8);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_d8 = (longdouble)CONCAT28(local_d8._8_2_,0x42);
      fmt::v5::format<char[6],void*>(&local_98,(v5 *)"{0:#}",(char (*) [6])&local_d8,args_01);
      std::__cxx11::string::~string((string *)&local_98);
    }
    testing::AssertionResult::operator<<
              (&gtest_ar,
               (char (*) [128])
               "Expected: format(\"{0:#}\", reinterpret_cast<void*>(0x42)) throws an exception of type format_error.\n  Actual: it throws nothing."
              );
    std::__cxx11::string::~string((string *)&gtest_expected_message);
  }
  testing::Message::Message((Message *)&gtest_expected_message);
  if (gtest_ar.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar3 = "";
  }
  else {
    pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_d8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
             ,0x42b,pcVar3);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)&local_d8,(Message *)&gtest_expected_message);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_expected_message);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(FormatterTest, HashFlag) {
  EXPECT_EQ("42", format("{0:#}", 42));
  EXPECT_EQ("-42", format("{0:#}", -42));
  EXPECT_EQ("0b101010", format("{0:#b}", 42));
  EXPECT_EQ("0B101010", format("{0:#B}", 42));
  EXPECT_EQ("-0b101010", format("{0:#b}", -42));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42));
  EXPECT_EQ("0X42", format("{0:#X}", 0x42));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42));
  EXPECT_EQ("042", format("{0:#o}", 042));
  EXPECT_EQ("-042", format("{0:#o}", -042));
  EXPECT_EQ("42", format("{0:#}", 42u));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42u));
  EXPECT_EQ("042", format("{0:#o}", 042u));

  EXPECT_EQ("-42", format("{0:#}", -42l));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42l));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42l));
  EXPECT_EQ("042", format("{0:#o}", 042l));
  EXPECT_EQ("-042", format("{0:#o}", -042l));
  EXPECT_EQ("42", format("{0:#}", 42ul));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ul));
  EXPECT_EQ("042", format("{0:#o}", 042ul));

  EXPECT_EQ("-42", format("{0:#}", -42ll));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ll));
  EXPECT_EQ("-0x42", format("{0:#x}", -0x42ll));
  EXPECT_EQ("042", format("{0:#o}", 042ll));
  EXPECT_EQ("-042", format("{0:#o}", -042ll));
  EXPECT_EQ("42", format("{0:#}", 42ull));
  EXPECT_EQ("0x42", format("{0:#x}", 0x42ull));
  EXPECT_EQ("042", format("{0:#o}", 042ull));

  if (FMT_USE_GRISU)
    EXPECT_EQ("-42.0", format("{0:#}", -42.0));
  else
    EXPECT_EQ("-42.0000", format("{0:#}", -42.0));
  EXPECT_EQ("-42.0000", format("{0:#}", -42.0l));
  EXPECT_THROW_MSG(format("{0:#", 'c'),
      format_error, "missing '}' in format string");
  EXPECT_THROW_MSG(format("{0:#}", 'c'),
      format_error, "invalid format specifier for char");
  EXPECT_THROW_MSG(format("{0:#}", "abc"),
      format_error, "format specifier requires numeric argument");
  EXPECT_THROW_MSG(format("{0:#}", reinterpret_cast<void*>(0x42)),
      format_error, "format specifier requires numeric argument");
}